

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetIncludeDirectoriesCommand::HandleDirectContent
          (cmTargetIncludeDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  cmListFileBacktrace lfbt;
  cmValueWithOrigin entry;
  string sStack_c8;
  cmListFileBacktrace local_a8;
  cmValueWithOrigin local_78;
  
  cmMakefile::GetBacktrace(&local_a8,(this->super_cmTargetPropCommandBase).super_cmCommand.Makefile)
  ;
  (*(this->super_cmTargetPropCommandBase).super_cmCommand.super_cmObject._vptr_cmObject[0x11])
            (&sStack_c8,this,content);
  cmValueWithOrigin::cmValueWithOrigin(&local_78,&sStack_c8,&local_a8);
  std::__cxx11::string::~string((string *)&sStack_c8);
  cmTarget::InsertInclude(tgt,&local_78,prepend);
  if (system) {
    cmTarget::AddSystemIncludeDirectories(tgt,content);
  }
  cmValueWithOrigin::~cmValueWithOrigin(&local_78);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return true;
}

Assistant:

bool cmTargetIncludeDirectoriesCommand
::HandleDirectContent(cmTarget *tgt, const std::vector<std::string> &content,
                      bool prepend, bool system)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmValueWithOrigin entry(this->Join(content), lfbt);
  tgt->InsertInclude(entry, prepend);
  if (system)
    {
    tgt->AddSystemIncludeDirectories(content);
    }
  return true;
}